

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O2

Image * nv::ImageIO::load(char *fileName,Stream *s)

{
  int iVar1;
  char *s1;
  Image *pIVar2;
  
  s1 = Path::extension(fileName);
  iVar1 = strCaseCmp(s1,".tga");
  if (iVar1 == 0) {
    pIVar2 = loadTGA(s);
    return pIVar2;
  }
  iVar1 = strCaseCmp(s1,".psd");
  if (iVar1 != 0) {
    return (Image *)0x0;
  }
  pIVar2 = loadPSD(s);
  return pIVar2;
}

Assistant:

Image * nv::ImageIO::load(const char * fileName, Stream & s)
{
	nvDebugCheck(fileName != NULL);
	nvDebugCheck(s.isLoading());

	const char * extension = Path::extension(fileName);
	
	if (strCaseCmp(extension, ".tga") == 0) {
		return ImageIO::loadTGA(s);
	}
#if defined(HAVE_JPEG)
	if (strCaseCmp(extension, ".jpg") == 0 || strCaseCmp(extension, ".jpeg") == 0) {
		return loadJPG(s);
	}
#endif
#if defined(HAVE_PNG)
	if (strCaseCmp(extension, ".png") == 0) {
		return loadPNG(s);
	}
#endif
	if (strCaseCmp(extension, ".psd") == 0) {
		return loadPSD(s);
	}
	// @@ use image plugins?
	return NULL;
}